

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

double Extra_Power2(int Degree)

{
  double dVar1;
  
  if (Degree < 0) {
    __assert_fail("Degree >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                  ,0x65,"double Extra_Power2(int)");
  }
  if (Degree < 0x20) {
    return (double)(1 << ((byte)Degree & 0x1f));
  }
  dVar1 = 1.0;
  do {
    dVar1 = dVar1 + dVar1;
    Degree = Degree + -1;
  } while (Degree != 0);
  return dVar1;
}

Assistant:

double Extra_Power2( int Degree )
{
    double Res;
    assert( Degree >= 0 );
    if ( Degree < 32 )
        return (double)(01<<Degree); 
    for ( Res = 1.0; Degree; Res *= 2.0, Degree-- );
    return Res;
}